

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffdt2s(int year,int month,int day,char *datestr,int *status)

{
  int iVar1;
  char *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int *in_R8;
  int *in_stack_00000070;
  int in_stack_00000078;
  int in_stack_0000007c;
  int in_stack_00000080;
  int local_4;
  
  if (*in_R8 < 1) {
    *in_RCX = '\0';
    iVar1 = ffverifydate(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
    if (iVar1 < 1) {
      if (((int)in_EDI < 0x76c) || (0x7ce < (int)in_EDI)) {
        sprintf(in_RCX,"%.4d-%.2d-%.2d",(ulong)in_EDI,(ulong)in_ESI,(ulong)in_EDX);
      }
      else {
        sprintf(in_RCX,"%.2d/%.2d/%.2d",(ulong)in_EDX,(ulong)in_ESI,(ulong)(in_EDI - 0x76c));
      }
      local_4 = *in_R8;
    }
    else {
      ffpmsg((char *)0x23d243);
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffdt2s(int year,          /* I - year (0 - 9999)           */
           int month,         /* I - month (1 - 12)            */
           int day,           /* I - day (1 - 31)              */
           char *datestr,     /* O - date string: "YYYY-MM-DD" */
           int   *status)     /* IO - error status             */
/*
  Construct a date character string
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datestr = '\0';
    
    if (ffverifydate(year, month, day, status) > 0)
    {
        ffpmsg("invalid date (ffdt2s)");
        return(*status);
    }

    if (year >= 1900 && year <= 1998)  /* use old 'dd/mm/yy' format */
        sprintf(datestr, "%.2d/%.2d/%.2d", day, month, year - 1900);

    else  /* use the new 'YYYY-MM-DD' format */
        sprintf(datestr, "%.4d-%.2d-%.2d", year, month, day);

    return(*status);
}